

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_add_qua_as_tri(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *qua_nodes)

{
  uint uVar1;
  REF_GLOB local_190;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tri_nodes [27];
  REF_INT node;
  REF_GLOB qua_global [27];
  REF_INT *qua_nodes_local;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  
  tri_nodes[1] = qua_nodes[4];
  for (tri_nodes[0x19] = 0; tri_nodes[0x19] < 4; tri_nodes[0x19] = tri_nodes[0x19] + 1) {
    if (((qua_nodes[tri_nodes[0x19]] < 0) || (ref_node->max <= qua_nodes[tri_nodes[0x19]])) ||
       (ref_node->global[qua_nodes[tri_nodes[0x19]]] < 0)) {
      local_190 = -1;
    }
    else {
      local_190 = ref_node->global[qua_nodes[tri_nodes[0x19]]];
    }
    *(REF_GLOB *)(tri_nodes + (long)tri_nodes[0x19] * 2 + 0x1a) = local_190;
  }
  if (((stack0xfffffffffffffef8 < qua_global[0]) && (stack0xfffffffffffffef8 < qua_global[2])) ||
     ((qua_global[1] < qua_global[0] && (qua_global[1] < qua_global[2])))) {
    ref_private_macro_code_rss_1 = *qua_nodes;
    ref_private_macro_code_rss = qua_nodes[2];
    tri_nodes[0] = qua_nodes[3];
    uVar1 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x43c
             ,"ref_shard_add_qua_as_tri",(ulong)uVar1,"a tri");
      return uVar1;
    }
    ref_private_macro_code_rss_1 = *qua_nodes;
    ref_private_macro_code_rss = qua_nodes[1];
    tri_nodes[0] = qua_nodes[2];
    uVar1 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x440
             ,"ref_shard_add_qua_as_tri",(ulong)uVar1,"a tri");
      return uVar1;
    }
  }
  else {
    ref_private_macro_code_rss_1 = *qua_nodes;
    ref_private_macro_code_rss = qua_nodes[1];
    tri_nodes[0] = qua_nodes[3];
    uVar1 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x448
             ,"ref_shard_add_qua_as_tri",(ulong)uVar1,"a tri");
      return uVar1;
    }
    ref_private_macro_code_rss_1 = qua_nodes[2];
    ref_private_macro_code_rss = qua_nodes[3];
    tri_nodes[0] = qua_nodes[1];
    uVar1 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x44c
             ,"ref_shard_add_qua_as_tri",(ulong)uVar1,"a tri");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_qua_as_tri(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *qua_nodes) {
  REF_GLOB qua_global[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];

  tri_nodes[3] = qua_nodes[4]; /* patch id */

  for (node = 0; node < 4; node++)
    qua_global[node] = ref_node_global(ref_node, qua_nodes[node]);

  if ((qua_global[0] < qua_global[1] && qua_global[0] < qua_global[3]) ||
      (qua_global[2] < qua_global[1] &&
       qua_global[2] < qua_global[3])) { /* 0-2 diag split of quad */
                                         /* 2-1
                                            |\|
                                            3-0 */
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[2];
    tri_nodes[2] = qua_nodes[3];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[1];
    tri_nodes[2] = qua_nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
  } else { /* 3-1 diag split of quad */
           /* 2-1
              |/|
              3-0 */
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[1];
    tri_nodes[2] = qua_nodes[3];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
    tri_nodes[0] = qua_nodes[2];
    tri_nodes[1] = qua_nodes[3];
    tri_nodes[2] = qua_nodes[1];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
  }
  return REF_SUCCESS;
}